

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PFloat::SetSymbols(PFloat *this,SymbolInitF *sym,size_t count)

{
  PClass *pPVar1;
  ENamedName EVar2;
  DObject *this_00;
  double *pdVar3;
  
  if (count != 0) {
    pdVar3 = &sym->Value;
    do {
      this_00 = (DObject *)
                M_Malloc_Dbg(0x38,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                             ,0x1f9);
      EVar2 = ((SymbolInitF *)(pdVar3 + -1))->Name;
      pPVar1 = (PClass *)*pdVar3;
      DObject::DObject(this_00);
      *(ENamedName *)&this_00->field_0x24 = EVar2;
      this_00[1]._vptr_DObject = (_func_int **)this;
      this_00->_vptr_DObject = (_func_int **)&PTR_StaticType_006f47b0;
      this_00[1].Class = pPVar1;
      PSymbolTable::AddSymbol(&(this->super_PBasicType).super_PType.Symbols,(PSymbol *)this_00);
      pdVar3 = pdVar3 + 2;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void PFloat::SetSymbols(const PFloat::SymbolInitF *sym, size_t count)
{
	for (size_t i = 0; i < count; ++i)
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(sym[i].Name, this, sym[i].Value));
	}
}